

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  uint uVar1;
  ARKodeERKStepMem step_mem;
  N_Vector p_Var2;
  sunrealtype *psVar3;
  N_Vector *pp_Var4;
  ARKodeButcherTable pAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  sunrealtype sVar10;
  uint local_44;
  sunrealtype *local_40;
  N_Vector local_38;
  
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeERKStepMem)0x0) {
    iVar7 = -0x15;
    arkProcessError(ark_mem,-0x15,0x58c,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var2 = ark_mem->ycur;
    local_38 = ark_mem->tempv1;
    psVar3 = step_mem->cvals;
    pp_Var4 = step_mem->Xvecs;
    *dsmPtr = 0.0;
    uVar1 = step_mem->stages;
    uVar9 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      psVar3[uVar9] = ark_mem->h * step_mem->B->b[uVar9];
      pp_Var4[uVar9] = step_mem->F[uVar9];
    }
    psVar3[uVar8] = 1.0;
    pp_Var4[uVar8] = ark_mem->yn;
    local_44 = (int)uVar8 + 1;
    local_40 = dsmPtr;
    if (0 < step_mem->nforcing) {
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pAVar5 = step_mem->B;
        step_mem->stage_times[uVar9] = pAVar5->c[uVar9] * ark_mem->h + ark_mem->tn;
        step_mem->stage_coefs[uVar9] = ark_mem->h * pAVar5->b[uVar9];
      }
      erkStep_ApplyForcing
                (step_mem,step_mem->stage_times,step_mem->stage_coefs,uVar1,(int *)&local_44);
    }
    iVar6 = N_VLinearCombination(local_44,psVar3,pp_Var4,p_Var2);
    iVar7 = -0x1c;
    if (iVar6 == 0) {
      if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        uVar1 = step_mem->stages;
        uVar8 = 0;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          psVar3[uVar8] = (step_mem->B->b[uVar8] - step_mem->B->d[uVar8]) * ark_mem->h;
          pp_Var4[uVar8] = step_mem->F[uVar8];
        }
        local_44 = (uint)uVar9;
        if (0 < step_mem->nforcing) {
          for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            pAVar5 = step_mem->B;
            step_mem->stage_times[uVar8] = pAVar5->c[uVar8] * ark_mem->h + ark_mem->tn;
            step_mem->stage_coefs[uVar8] = (pAVar5->b[uVar8] - pAVar5->d[uVar8]) * ark_mem->h;
          }
          erkStep_ApplyForcing
                    (step_mem,step_mem->stage_times,step_mem->stage_coefs,uVar1,(int *)&local_44);
          uVar9 = (ulong)local_44;
        }
        p_Var2 = local_38;
        iVar7 = N_VLinearCombination(uVar9,psVar3,pp_Var4,local_38);
        if (iVar7 != 0) {
          return -0x1c;
        }
        sVar10 = (sunrealtype)N_VWrmsNorm(p_Var2,ark_mem->ewt);
        *local_40 = sVar10;
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /* apply external polynomial forcing */
  if (step_mem->nforcing > 0)
  {
    for (j = 0; j < step_mem->stages; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * step_mem->B->b[j];
    }
    erkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         step_mem->stages, &nvec);
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity or error accumulation enabled) */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* apply external polynomial forcing */
    if (step_mem->nforcing > 0)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h *
                                   (step_mem->B->b[j] - step_mem->B->d[j]);
      }
      erkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}